

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O1

int uv_cpu_info(uv_cpu_info_t **cpu_infos,int *count)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  uv_cpu_info_t *cpu_infos_00;
  FILE *pFVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  int *piVar9;
  uv_cpu_info_t *puVar10;
  uint unaff_EBP;
  ulong __nmemb;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint64_t user;
  uint local_474;
  uint *local_470;
  uv_cpu_info_t **local_468;
  uint64_t irq;
  uint64_t idle;
  uint64_t sys;
  uint64_t nice;
  uint64_t dummy;
  char buf [1024];
  
  *cpu_infos = (uv_cpu_info_t *)0x0;
  *count = 0;
  __stream = (FILE *)uv__open_file("/proc/stat");
  if (__stream == (FILE *)0x0) {
    piVar9 = __errno_location();
    return -*piVar9;
  }
  pcVar4 = fgets(buf,0x400,__stream);
  if (pcVar4 == (char *)0x0) {
    iVar14 = -5;
  }
  else {
    pcVar4 = fgets(buf,0x400,__stream);
    unaff_EBP = 0;
    if (pcVar4 != (char *)0x0) {
      do {
        if (buf[2] != 'u' || buf._0_2_ != 0x7063) break;
        unaff_EBP = unaff_EBP + 1;
        pcVar4 = fgets(buf,0x400,__stream);
      } while (pcVar4 != (char *)0x0);
    }
    iVar14 = (uint)(unaff_EBP != 0) * 5 + -5;
  }
  if (-1 < iVar14) {
    __nmemb = (ulong)unaff_EBP;
    local_468 = cpu_infos;
    cpu_infos_00 = (uv_cpu_info_t *)uv__calloc(__nmemb,0x38);
    if (cpu_infos_00 != (uv_cpu_info_t *)0x0) {
      pFVar5 = (FILE *)uv__open_file("/proc/cpuinfo");
      local_470 = (uint *)count;
      if (pFVar5 == (FILE *)0x0) {
        piVar9 = __errno_location();
        iVar14 = -*piVar9;
      }
      else {
        pcVar4 = fgets(buf,0x400,pFVar5);
        if (pcVar4 == (char *)0x0) {
          uVar8 = 0;
        }
        else {
          uVar13 = 0;
          uVar8 = 0;
          do {
            uVar13 = uVar13 & 0xffffffff;
            while ((__nmemb <= uVar8 ||
                   (CONCAT26(buf._11_2_,CONCAT33(buf._8_3_,buf._5_3_)) != 0x203a09656d616e20 ||
                    CONCAT44(buf._4_4_,CONCAT13(buf[3],CONCAT12(buf[2],buf._0_2_))) !=
                    0x616e206c65646f6d))) {
              uVar15 = uVar13;
              if ((uVar13 < __nmemb) &&
                 (CONCAT35(buf._8_3_,CONCAT41(buf._4_4_,buf[3])) == 0x203a09097a484d20 &&
                  CONCAT44(buf._4_4_,CONCAT13(buf[3],CONCAT12(buf[2],buf._0_2_))) ==
                  0x97a484d20757063)) {
                iVar14 = atoi(buf + 0xb);
                uVar15 = uVar13 + 1;
                cpu_infos_00[uVar13].speed = iVar14;
              }
              pcVar4 = fgets(buf,0x400,pFVar5);
              uVar13 = uVar15;
              if (pcVar4 == (char *)0x0) goto LAB_0011eee6;
            }
            sVar6 = strlen(buf + 0xd);
            pcVar4 = uv__strndup(buf + 0xd,sVar6 - 1);
            if (pcVar4 == (char *)0x0) {
              fclose(pFVar5);
              goto LAB_0011ef55;
            }
            uVar15 = uVar8 + 1;
            cpu_infos_00[uVar8].model = pcVar4;
            pcVar4 = fgets(buf,0x400,pFVar5);
            uVar8 = uVar15;
          } while (pcVar4 != (char *)0x0);
        }
LAB_0011eee6:
        fclose(pFVar5);
        uVar11 = (uint)uVar8;
        if (uVar11 == 0) {
          pcVar4 = "unknown";
        }
        else {
          pcVar4 = cpu_infos_00[uVar11 - 1].model;
        }
        iVar14 = 0;
        if (uVar11 < unaff_EBP) {
          puVar10 = cpu_infos_00 + (uVar8 & 0xffffffff);
          lVar12 = __nmemb - (uVar8 & 0xffffffff);
          do {
            sVar6 = strlen(pcVar4);
            pcVar7 = uv__strndup(pcVar4,sVar6);
            if (pcVar7 == (char *)0x0) goto LAB_0011ef55;
            puVar10->model = pcVar7;
            puVar10 = puVar10 + 1;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
        }
      }
      goto LAB_0011ef60;
    }
    iVar14 = -0xc;
  }
LAB_0011f1e2:
  iVar3 = fclose(__stream);
  if (iVar3 != 0) {
    piVar9 = __errno_location();
    if ((*piVar9 != 4) && (*piVar9 != 0x73)) {
LAB_0011f214:
      abort();
    }
  }
  return iVar14;
LAB_0011ef55:
  iVar14 = -0xc;
LAB_0011ef60:
  if (iVar14 == 0) {
    uVar8 = sysconf(2);
    if ((int)uVar8 == 0) {
      __assert_fail("ticks != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/linux-core.c"
                    ,0x1da,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
    }
    if ((int)uVar8 == -1) {
      __assert_fail("ticks != (unsigned int) -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/linux-core.c"
                    ,0x1d9,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar8 & 0xffffffff;
    lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000)) / auVar2,0);
    rewind(__stream);
    pcVar4 = fgets(buf,0x400,__stream);
    if (pcVar4 == (char *)0x0) goto LAB_0011f214;
    pcVar4 = fgets(buf,0x400,__stream);
    uVar8 = 0;
    if ((unaff_EBP != 0) && (pcVar4 != (char *)0x0)) {
      uVar13 = 0;
      while (uVar8 = uVar13, buf[2] == 'u' && buf._0_2_ == 0x7063) {
        iVar14 = sscanf(buf,"cpu%u ",&local_474);
        if (iVar14 != 1) {
          __assert_fail("r == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/linux-core.c"
                        ,0x1ef,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
        }
        pcVar4 = buf + 4;
        uVar11 = local_474;
        do {
          pcVar4 = pcVar4 + 1;
          bVar1 = 9 < uVar11;
          uVar11 = uVar11 / 10;
        } while (bVar1);
        iVar14 = sscanf(pcVar4,"%lu %lu %lu%lu %lu %lu",&user,&nice,&sys,&idle,&dummy,&irq);
        if (iVar14 != 6) goto LAB_0011f214;
        uVar8 = uVar13 + 1;
        cpu_infos_00[uVar13].cpu_times.user = user * lVar12;
        cpu_infos_00[uVar13].cpu_times.nice = nice * lVar12;
        cpu_infos_00[uVar13].cpu_times.sys = sys * lVar12;
        cpu_infos_00[uVar13].cpu_times.idle = idle * lVar12;
        cpu_infos_00[uVar13].cpu_times.irq = irq * lVar12;
        pcVar4 = fgets(buf,0x400,__stream);
        if ((pcVar4 == (char *)0x0) || (uVar13 = uVar8, __nmemb <= uVar8)) break;
      }
    }
    if (uVar8 != __nmemb) {
      __assert_fail("num == numcpus",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/linux-core.c"
                    ,0x20c,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
    }
    iVar14 = 0;
  }
  if (iVar14 == 0) {
    if (unaff_EBP != 0 && cpu_infos_00->speed == 0) {
      piVar9 = &cpu_infos_00->speed;
      uVar8 = 0;
      do {
        snprintf(buf,0x400,"/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq",
                 uVar8 & 0xffffffff);
        pFVar5 = (FILE *)uv__open_file(buf);
        iVar14 = 0;
        if (pFVar5 != (FILE *)0x0) {
          iVar14 = fscanf(pFVar5,"%lu",&user);
          if (iVar14 != 1) {
            user = 0;
          }
          fclose(pFVar5);
          iVar14 = (int)(user / 1000);
        }
        *piVar9 = iVar14;
        uVar8 = uVar8 + 1;
        piVar9 = piVar9 + 0xe;
      } while (__nmemb != uVar8);
    }
    *local_468 = cpu_infos_00;
    *local_470 = unaff_EBP;
    iVar14 = 0;
  }
  else {
    uv_free_cpu_info(cpu_infos_00,unaff_EBP);
  }
  goto LAB_0011f1e2;
}

Assistant:

int uv_cpu_info(uv_cpu_info_t** cpu_infos, int* count) {
  unsigned int numcpus;
  uv_cpu_info_t* ci;
  int err;
  FILE* statfile_fp;

  *cpu_infos = NULL;
  *count = 0;

  statfile_fp = uv__open_file("/proc/stat");
  if (statfile_fp == NULL)
    return UV__ERR(errno);

  err = uv__cpu_num(statfile_fp, &numcpus);
  if (err < 0)
    goto out;

  err = UV_ENOMEM;
  ci = uv__calloc(numcpus, sizeof(*ci));
  if (ci == NULL)
    goto out;

  err = read_models(numcpus, ci);
  if (err == 0)
    err = read_times(statfile_fp, numcpus, ci);

  if (err) {
    uv_free_cpu_info(ci, numcpus);
    goto out;
  }

  /* read_models() on x86 also reads the CPU speed from /proc/cpuinfo.
   * We don't check for errors here. Worst case, the field is left zero.
   */
  if (ci[0].speed == 0)
    read_speeds(numcpus, ci);

  *cpu_infos = ci;
  *count = numcpus;
  err = 0;

out:

  if (fclose(statfile_fp))
    if (errno != EINTR && errno != EINPROGRESS)
      abort();

  return err;
}